

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall CoreML::Specification::LossLayer::ByteSizeLong(LossLayer *this)

{
  string *value;
  size_t sVar1;
  size_t sVar2;
  
  value = (this->name_).ptr_;
  if (value->_M_string_length == 0) {
    sVar1 = 0;
  }
  else {
    sVar1 = google::protobuf::internal::WireFormatLite::StringSize(value);
    sVar1 = sVar1 + 1;
  }
  if (this->_oneof_case_[0] == 0xb) {
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::MeanSquaredErrorLossLayer>
                      ((this->LossLayerType_).meansquarederrorlosslayer_);
  }
  else {
    if (this->_oneof_case_[0] != 10) goto LAB_001eb6e7;
    sVar2 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::CategoricalCrossEntropyLossLayer>
                      ((this->LossLayerType_).categoricalcrossentropylosslayer_);
  }
  sVar1 = sVar1 + sVar2 + 1;
LAB_001eb6e7:
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t LossLayer::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LossLayer)
  size_t total_size = 0;

  // string name = 1;
  if (this->name().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->name());
  }

  switch (LossLayerType_case()) {
    // .CoreML.Specification.CategoricalCrossEntropyLossLayer categoricalCrossEntropyLossLayer = 10;
    case kCategoricalCrossEntropyLossLayer: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *LossLayerType_.categoricalcrossentropylosslayer_);
      break;
    }
    // .CoreML.Specification.MeanSquaredErrorLossLayer meanSquaredErrorLossLayer = 11;
    case kMeanSquaredErrorLossLayer: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *LossLayerType_.meansquarederrorlosslayer_);
      break;
    }
    case LOSSLAYERTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}